

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomGradient::read(DomGradient *this,int __fd,void *__buf,size_t __nbytes)

{
  storage_type_conflict *psVar1;
  double dVar2;
  char cVar3;
  int iVar4;
  DomGradientStop *this_00;
  char16_t *__nbytes_00;
  void *__buf_00;
  long lVar5;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QStringView QVar31;
  QStringView QVar32;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QString local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  if (local_50.size != 0) {
    lVar5 = 0;
    do {
      psVar1 = *(storage_type_conflict **)(local_50.ptr + lVar5 + 8);
      local_68.m_size = *(qsizetype *)(local_50.ptr + lVar5 + 0x10);
      local_68.m_data = psVar1;
      switch(local_68.m_size) {
      case 4:
        QVar6.m_data = psVar1;
        QVar6.m_size = 4;
        QVar19.m_data = L"endx";
        QVar19.m_size = 4;
        cVar3 = QtPrivate::equalStrings(QVar6,QVar19);
        if (cVar3 == '\0') {
          QVar12.m_data = psVar1;
          QVar12.m_size = 4;
          QVar25.m_data = L"endy";
          QVar25.m_size = 4;
          cVar3 = QtPrivate::equalStrings(QVar12,QVar25);
          if (cVar3 == '\0') {
            QVar15.m_data = psVar1;
            QVar15.m_size = 4;
            QVar28.m_data = L"type";
            QVar28.m_size = 4;
            cVar3 = QtPrivate::equalStrings(QVar15,QVar28);
            if (cVar3 != '\0') {
              QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar5 + 0x50),
                               *(longlong *)(local_50.ptr + lVar5 + 0x58));
              QString::operator=(&this->m_attr_type,&local_80);
              this->m_has_attr_type = true;
              goto LAB_00162578;
            }
            goto switchD_0016211d_caseD_7;
          }
          local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
          local_80.d.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
          dVar2 = (double)QStringView::toDouble((bool *)&local_80);
          this->m_attr_endY = dVar2;
          this->m_has_attr_endY = true;
        }
        else {
          local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
          local_80.d.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
          dVar2 = (double)QStringView::toDouble((bool *)&local_80);
          this->m_attr_endX = dVar2;
          this->m_has_attr_endX = true;
        }
        break;
      case 5:
        QVar8.m_data = psVar1;
        QVar8.m_size = 5;
        QVar21.m_data = L"angle";
        QVar21.m_size = 5;
        cVar3 = QtPrivate::equalStrings(QVar8,QVar21);
        if (cVar3 == '\0') goto switchD_0016211d_caseD_7;
        local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
        local_80.d.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
        dVar2 = (double)QStringView::toDouble((bool *)&local_80);
        this->m_attr_angle = dVar2;
        this->m_has_attr_angle = true;
        break;
      case 6:
        QVar7.m_data = psVar1;
        QVar7.m_size = 6;
        QVar20.m_data = L"startx";
        QVar20.m_size = 6;
        cVar3 = QtPrivate::equalStrings(QVar7,QVar20);
        if (cVar3 == '\0') {
          QVar11.m_data = psVar1;
          QVar11.m_size = 6;
          QVar24.m_data = L"starty";
          QVar24.m_size = 6;
          cVar3 = QtPrivate::equalStrings(QVar11,QVar24);
          if (cVar3 == '\0') {
            QVar14.m_data = psVar1;
            QVar14.m_size = 6;
            QVar27.m_data = L"focalx";
            QVar27.m_size = 6;
            cVar3 = QtPrivate::equalStrings(QVar14,QVar27);
            if (cVar3 == '\0') {
              QVar16.m_data = psVar1;
              QVar16.m_size = 6;
              QVar29.m_data = L"focaly";
              QVar29.m_size = 6;
              cVar3 = QtPrivate::equalStrings(QVar16,QVar29);
              if (cVar3 == '\0') {
                QVar17.m_data = psVar1;
                QVar17.m_size = 6;
                QVar30.m_data = L"radius";
                QVar30.m_size = 6;
                cVar3 = QtPrivate::equalStrings(QVar17,QVar30);
                if (cVar3 == '\0') {
                  QVar18.m_data = psVar1;
                  QVar18.m_size = 6;
                  QVar31.m_data = L"spread";
                  QVar31.m_size = 6;
                  cVar3 = QtPrivate::equalStrings(QVar18,QVar31);
                  if (cVar3 != '\0') {
                    QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar5 + 0x50),
                                     *(longlong *)(local_50.ptr + lVar5 + 0x58));
                    QString::operator=(&this->m_attr_spread,&local_80);
                    this->m_has_attr_spread = true;
                    goto LAB_00162578;
                  }
                  goto switchD_0016211d_caseD_7;
                }
                local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
                local_80.d.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
                dVar2 = (double)QStringView::toDouble((bool *)&local_80);
                this->m_attr_radius = dVar2;
                this->m_has_attr_radius = true;
              }
              else {
                local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
                local_80.d.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
                dVar2 = (double)QStringView::toDouble((bool *)&local_80);
                this->m_attr_focalY = dVar2;
                this->m_has_attr_focalY = true;
              }
            }
            else {
              local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
              local_80.d.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
              dVar2 = (double)QStringView::toDouble((bool *)&local_80);
              this->m_attr_focalX = dVar2;
              this->m_has_attr_focalX = true;
            }
          }
          else {
            local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
            local_80.d.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
            dVar2 = (double)QStringView::toDouble((bool *)&local_80);
            this->m_attr_startY = dVar2;
            this->m_has_attr_startY = true;
          }
        }
        else {
          local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
          local_80.d.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
          dVar2 = (double)QStringView::toDouble((bool *)&local_80);
          this->m_attr_startX = dVar2;
          this->m_has_attr_startX = true;
        }
        break;
      default:
switchD_0016211d_caseD_7:
        local_98.a.m_size = 0x15;
        local_98.a.m_data = "Unexpected attribute ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>(&local_80,&local_98);
        QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
        goto LAB_00162578;
      case 8:
        QVar9.m_data = psVar1;
        QVar9.m_size = 8;
        QVar22.m_data = L"centralx";
        QVar22.m_size = 8;
        cVar3 = QtPrivate::equalStrings(QVar9,QVar22);
        if (cVar3 == '\0') {
          QVar13.m_data = psVar1;
          QVar13.m_size = 8;
          QVar26.m_data = L"centraly";
          QVar26.m_size = 8;
          cVar3 = QtPrivate::equalStrings(QVar13,QVar26);
          if (cVar3 == '\0') goto switchD_0016211d_caseD_7;
          local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
          local_80.d.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
          dVar2 = (double)QStringView::toDouble((bool *)&local_80);
          this->m_attr_centralY = dVar2;
          this->m_has_attr_centralY = true;
        }
        else {
          local_80.d.ptr = *(char16_t **)(local_50.ptr + lVar5 + 0x50);
          local_80.d.d = *(Data **)(local_50.ptr + lVar5 + 0x58);
          dVar2 = (double)QStringView::toDouble((bool *)&local_80);
          this->m_attr_centralX = dVar2;
          this->m_has_attr_centralX = true;
        }
        break;
      case 0xe:
        QVar10.m_data = psVar1;
        QVar10.m_size = 0xe;
        QVar23.m_data = L"coordinatemode";
        QVar23.m_size = 0xe;
        cVar3 = QtPrivate::equalStrings(QVar10,QVar23);
        if (cVar3 == '\0') goto switchD_0016211d_caseD_7;
        QString::QString(&local_80,*(QChar **)(local_50.ptr + lVar5 + 0x50),
                         *(longlong *)(local_50.ptr + lVar5 + 0x58));
        QString::operator=(&this->m_attr_coordinateMode,&local_80);
        this->m_has_attr_coordinateMode = true;
LAB_00162578:
        if ((DomGradientStop *)local_80.d.d != (DomGradientStop *)0x0) {
          LOCK();
          *(int *)&(local_80.d.d)->super_QArrayData = *(int *)&(local_80.d.d)->super_QArrayData + -1
          ;
          UNLOCK();
          if (*(int *)&(local_80.d.d)->super_QArrayData == 0) {
            QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      lVar5 = lVar5 + 0x68;
    } while (local_50.size * 0x68 - lVar5 != 0);
  }
  iVar4 = QXmlStreamReader::error();
  if (iVar4 == 0) {
    do {
      iVar4 = QXmlStreamReader::readNext();
      if (iVar4 == 4) {
        local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = (QStringView)QXmlStreamReader::name();
        QVar32.m_data = L"gradientstop";
        QVar32.m_size = 0xc;
        __nbytes_00 = L"gradientstop";
        iVar4 = QtPrivate::compareStrings(local_68,QVar32,CaseInsensitive);
        if (iVar4 == 0) {
          this_00 = (DomGradientStop *)operator_new(0x18);
          this_00->m_attr_position = 0.0;
          this_00->m_has_attr_position = false;
          *(undefined3 *)&this_00->field_0x9 = 0;
          this_00->m_children = 0;
          this_00->m_color = (DomColor *)0x0;
          DomGradientStop::read(this_00,__fd,__buf_00,(size_t)__nbytes_00);
          local_80.d.d = (Data *)this_00;
          QtPrivate::QPodArrayOps<DomGradientStop*>::emplace<DomGradientStop*&>
                    ((QPodArrayOps<DomGradientStop*> *)&this->m_gradientStop,
                     (this->m_gradientStop).d.size,(DomGradientStop **)&local_80);
          QList<DomGradientStop_*>::end(&this->m_gradientStop);
        }
        else {
          local_98.a.m_size = 0x13;
          local_98.a.m_data = "Unexpected element ";
          local_98.b = &local_68;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    (&local_80,&local_98);
          QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
          if ((DomGradientStop *)local_80.d.d != (DomGradientStop *)0x0) {
            LOCK();
            *(int *)&(local_80.d.d)->super_QArrayData =
                 *(int *)&(local_80.d.d)->super_QArrayData + -1;
            UNLOCK();
            if (*(int *)&(local_80.d.d)->super_QArrayData == 0) {
              QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      else if (iVar4 == 5) break;
      iVar4 = QXmlStreamReader::error();
    } while (iVar4 == 0);
  }
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomGradient::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"startx"_s) {
            setAttributeStartX(attribute.value().toDouble());
            continue;
        }
        if (name == u"starty"_s) {
            setAttributeStartY(attribute.value().toDouble());
            continue;
        }
        if (name == u"endx"_s) {
            setAttributeEndX(attribute.value().toDouble());
            continue;
        }
        if (name == u"endy"_s) {
            setAttributeEndY(attribute.value().toDouble());
            continue;
        }
        if (name == u"centralx"_s) {
            setAttributeCentralX(attribute.value().toDouble());
            continue;
        }
        if (name == u"centraly"_s) {
            setAttributeCentralY(attribute.value().toDouble());
            continue;
        }
        if (name == u"focalx"_s) {
            setAttributeFocalX(attribute.value().toDouble());
            continue;
        }
        if (name == u"focaly"_s) {
            setAttributeFocalY(attribute.value().toDouble());
            continue;
        }
        if (name == u"radius"_s) {
            setAttributeRadius(attribute.value().toDouble());
            continue;
        }
        if (name == u"angle"_s) {
            setAttributeAngle(attribute.value().toDouble());
            continue;
        }
        if (name == u"type"_s) {
            setAttributeType(attribute.value().toString());
            continue;
        }
        if (name == u"spread"_s) {
            setAttributeSpread(attribute.value().toString());
            continue;
        }
        if (name == u"coordinatemode"_s) {
            setAttributeCoordinateMode(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"gradientstop"_s, Qt::CaseInsensitive)) {
                auto *v = new DomGradientStop();
                v->read(reader);
                m_gradientStop.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}